

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatDatatypeValidator.cpp
# Opt level: O3

XSerializable * xercesc_4_0::FloatDatatypeValidator::createObject(MemoryManager *manager)

{
  FloatDatatypeValidator *this;
  
  this = (FloatDatatypeValidator *)XMemory::operator_new(0xa0,manager);
  FloatDatatypeValidator(this,manager);
  return (XSerializable *)this;
}

Assistant:

void FloatDatatypeValidator::serialize(XSerializeEngine& serEng)
{
    /***
     * Note: 
     *
     *     During storing, we need write the specific number
     *     type info before calling base::serialize().
     *
     *     While loading, we do nothing here
     ***/

    if (serEng.isStoring())
    {
        serEng<<(int) (XMLNumber::Float);
    }

    AbstractNumericValidator::serialize(serEng);

}